

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O3

bool libtest::unit_test<libtest::a_plus_b>::check<(anonymous_namespace)::tle_hard>
               (path *input_file_path)

{
  size_type sVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  path *ppVar6;
  time_point start;
  usize time_ms;
  path solution_out_path;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  path local_80;
  path local_58;
  path local_30;
  
  if ((check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::input_file ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                                   ::input_file), iVar4 != 0)) {
    std::ifstream::ifstream
              (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
               input_file);
    __cxa_atexit(std::ifstream::~ifstream,
                 check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                 input_file,&__dso_handle);
    __cxa_guard_release(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                         ::input_file);
  }
  if ((check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
       generated_output_file == '\0') &&
     (iVar4 = __cxa_guard_acquire(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                                   ::generated_output_file), iVar4 != 0)) {
    std::ifstream::ifstream
              (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
               generated_output_file);
    __cxa_atexit(std::ifstream::~ifstream,
                 check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                 generated_output_file,&__dso_handle);
    __cxa_guard_release(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                         ::generated_output_file);
  }
  if ((check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
       solution_output_file_in == '\0') &&
     (iVar4 = __cxa_guard_acquire(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                                   ::solution_output_file_in), iVar4 != 0)) {
    std::ifstream::ifstream
              (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
               solution_output_file_in);
    __cxa_atexit(std::ifstream::~ifstream,
                 check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file_in,&__dso_handle);
    __cxa_guard_release(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                         ::solution_output_file_in);
  }
  if ((check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
       solution_output_file == '\0') &&
     (iVar4 = __cxa_guard_acquire(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                                   ::solution_output_file), iVar4 != 0)) {
    std::ofstream::ofstream
              (check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
               solution_output_file);
    __cxa_atexit(std::ofstream::~ofstream,
                 check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file,&__dso_handle);
    __cxa_guard_release(&check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                         ::solution_output_file);
  }
  local_30._M_pathname._M_dataplus._M_p = (pointer)0x20;
  printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)&local_30,"[ RUN      ] ");
  sVar1 = (input_file_path->_M_pathname)._M_string_length;
  if (sVar1 != 0) {
    uVar2 = *(ulong *)&input_file_path->_M_cmpts;
    uVar3 = (uint)uVar2;
    ppVar6 = input_file_path;
    if ((uVar2 & 3) == 0) {
      if ((input_file_path->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/') {
        if ((uVar2 & 3) == 0) {
          lVar5 = std::filesystem::__cxx11::path::_List::end();
          ppVar6 = (path *)(lVar5 + -0x30);
          if ((*(ulong *)&input_file_path->_M_cmpts & 3) != 0) {
            ppVar6 = input_file_path;
          }
          uVar3 = (uint)*(undefined8 *)&ppVar6->_M_cmpts;
        }
        if ((~uVar3 & 3) == 0) goto LAB_00107147;
      }
    }
    else if ((uVar3 & 3) == 3) {
LAB_00107147:
      std::filesystem::__cxx11::path::path(&local_80,ppVar6);
      goto LAB_00107194;
    }
  }
  std::filesystem::__cxx11::path::path(&local_80);
LAB_00107194:
  cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_80);
  std::filesystem::__cxx11::path::~path(&local_80);
  std::filesystem::__cxx11::path::path(&local_30,input_file_path);
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_58,(char (*) [5])".txt",auto_format);
  std::filesystem::__cxx11::path::replace_extension(&local_30);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::ifstream::open(check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                      ::input_file,(_Ios_Openmode)(input_file_path->_M_pathname)._M_dataplus._M_p);
  std::ofstream::open(check<(anonymous_namespace)::tle_hard>(std::filesystem::__cxx11::path_const&)
                      ::solution_output_file,(_Ios_Openmode)local_30._M_pathname._M_dataplus._M_p);
  local_88 = 200;
  local_90 = std::chrono::_V2::system_clock::now();
  local_98 = 0;
  local_58._M_pathname._M_dataplus._M_p = (pointer)operator_new(0x18);
  *(undefined ***)local_58._M_pathname._M_dataplus._M_p = &PTR___State_0010ed60;
  *(undefined8 **)((long)local_58._M_pathname._M_dataplus._M_p + 8) = &local_88;
  *(undefined8 **)((long)local_58._M_pathname._M_dataplus._M_p + 0x10) = &local_90;
  std::thread::_M_start_thread(&local_98,&local_58,0);
  if ((long *)local_58._M_pathname._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_58._M_pathname._M_dataplus._M_p + 8))();
  }
  do {
  } while( true );
}

Assistant:

static bool check(const fs::path& input_file_path)
    {
        static std::ifstream input_file, generated_output_file, solution_output_file_in;
        static std::ofstream solution_output_file;
        cprintf(ac_color, "[ RUN      ] "), cprintln(message_color, input_file_path.filename());
        auto solution_out_path = input_file_path;
        solution_out_path.replace_extension(".txt");
        input_file.open(input_file_path), solution_output_file.open(solution_out_path);
        const usize time_ms = run([&]() { Solution::solve(input_file, solution_output_file); });
        input_file.close(), solution_output_file.close();
        bool passed = false;
        if (time_ms >= Problem::time_limit) {
            cprintf(tle_color, "[      TLE ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
        } else {
            auto generated_out_path = input_file_path;
            generated_out_path.replace_extension(".out");
            if (fs::exists(generated_out_path)) {
                input_file.open(input_file_path), generated_output_file.open(generated_out_path), solution_output_file_in.open(solution_out_path);
                const bool ok = Problem::judge(input_file, generated_output_file, solution_output_file_in);
                if (not ok) {
                    cprintf(wa_color, "[       WA ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                    std::ifstream in_file{input_file_path}, gen_file{generated_out_path}, sol_file{solution_out_path};
                    std::string line;
                    cprintln(message_color, "(Input)");
                    while (std::getline(in_file, line)) { cprintln(message_color, line); }
                    cprintln(message_color, "(Expected)");
                    while (std::getline(gen_file, line)) { cprintln(message_color, line); }
                    cprintln(message_color, "(Output)");
                    while (std::getline(sol_file, line)) { cprintln(message_color, line); }
                } else {
                    cprintf(ac_color, "[       AC ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                    passed = true;
                }
                solution_output_file_in.close();
            } else {
                cprintf(ac_color, "[       OK ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                passed = true;
            }
        }
        generated_output_file.close(), input_file.close(), solution_output_file.close();
        return passed;
    }